

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall soul::StructuralParser::parseLogicalOr(StructuralParser *this)

{
  bool bVar1;
  Expression *pEVar2;
  Constant *pCVar3;
  TernaryOp *o;
  pool_ref<soul::AST::Expression> local_a8;
  Expression *local_a0;
  Expression *falseBranch;
  Constant *local_58;
  Constant *trueBranch;
  undefined1 local_38 [8];
  Context context;
  pool_ref<soul::AST::Expression> local_18;
  pool_ref<soul::AST::Expression> a;
  StructuralParser *this_local;
  
  a.object = (Expression *)this;
  pEVar2 = parseLogicalAnd(this);
  pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_18,pEVar2);
  while( true ) {
    context.parentScope = (Scope *)anon_var_dwarf_10ef80;
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)"||");
    if (!bVar1) break;
    getContext((Context *)local_38,this);
    trueBranch = (Constant *)
                 Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::skip(&this->super_SOULTokeniser);
    soul::Value::Value((Value *)&falseBranch,true);
    pCVar3 = allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (this,(Context *)local_38,(Value *)&falseBranch);
    soul::Value::~Value((Value *)&falseBranch);
    local_58 = pCVar3;
    local_a0 = parseLogicalAnd(this);
    o = allocate<soul::AST::TernaryOp,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::AST::Constant&,soul::AST::Expression&>
                  (this,(Context *)local_38,&local_18,local_58,local_a0);
    pool_ref<soul::AST::Expression>::pool_ref<soul::AST::TernaryOp,void>(&local_a8,o);
    local_18.object = local_a8.object;
    pool_ref<soul::AST::Expression>::~pool_ref(&local_a8);
    AST::Context::~Context((Context *)local_38);
  }
  pEVar2 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_18);
  pool_ref<soul::AST::Expression>::~pool_ref(&local_18);
  return pEVar2;
}

Assistant:

AST::Expression& parseLogicalOr()
    {
        for (pool_ref<AST::Expression> a = parseLogicalAnd();;)
        {
            if (! matches (Operator::logicalOr))
                return a;

            auto context = getContext();
            skip();
            auto& trueBranch = allocate<AST::Constant> (context, Value (true));
            auto& falseBranch = parseLogicalAnd();
            a = allocate<AST::TernaryOp> (context, a, trueBranch, falseBranch);
        }
    }